

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_module.cpp
# Opt level: O3

unique_ptr<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_> __thiscall
spvtools::BuildModule
          (spvtools *this,spv_target_env env,MessageConsumer *consumer,string *text,
          uint32_t assemble_options)

{
  _Manager_type p_Var1;
  bool bVar2;
  SpirvTools t;
  vector<unsigned_int,_std::allocator<unsigned_int>_> binary;
  SpirvTools local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type p_Stack_60;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type p_Stack_40;
  
  SpirvTools::SpirvTools(&local_a0,env);
  local_48 = (_Manager_type)0x0;
  p_Stack_40 = (_Invoker_type)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  p_Var1 = (consumer->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)(&local_58,(_Any_data *)consumer,__clone_functor);
    local_48 = (consumer->super__Function_base)._M_manager;
    p_Stack_40 = consumer->_M_invoker;
  }
  SpirvTools::SetMessageConsumer(&local_a0,(MessageConsumer *)&local_58);
  if (local_48 != (_Manager_type)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint32_t *)0x0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = SpirvTools::Assemble(&local_a0,text,&local_98,assemble_options);
  if (bVar2) {
    local_68 = (_Manager_type)0x0;
    p_Stack_60 = (_Invoker_type)0x0;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    p_Var1 = (consumer->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      (*p_Var1)(&local_78,(_Any_data *)consumer,__clone_functor);
      local_68 = (consumer->super__Function_base)._M_manager;
      p_Stack_60 = consumer->_M_invoker;
    }
    BuildModule(this,env,(MessageConsumer *)&local_78,
                local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start,
                (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2);
    if (local_68 != (_Manager_type)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
  }
  else {
    *(undefined8 *)this = 0;
  }
  if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint32_t *)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  SpirvTools::~SpirvTools(&local_a0);
  return (__uniq_ptr_data<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<opt::IRContext> BuildModule(spv_target_env env,
                                            MessageConsumer consumer,
                                            const std::string& text,
                                            uint32_t assemble_options) {
  SpirvTools t(env);
  t.SetMessageConsumer(consumer);
  std::vector<uint32_t> binary;
  if (!t.Assemble(text, &binary, assemble_options)) return nullptr;
  return BuildModule(env, consumer, binary.data(), binary.size());
}